

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000024bc80 = 0x2e2e2e2e2e2e2e;
    uRam000000000024bc87._0_1_ = '.';
    uRam000000000024bc87._1_1_ = '.';
    uRam000000000024bc87._2_1_ = '.';
    uRam000000000024bc87._3_1_ = '.';
    uRam000000000024bc87._4_1_ = '.';
    uRam000000000024bc87._5_1_ = '.';
    uRam000000000024bc87._6_1_ = '.';
    uRam000000000024bc87._7_1_ = '.';
    DAT_0024bc70 = '.';
    DAT_0024bc70_1._0_1_ = '.';
    DAT_0024bc70_1._1_1_ = '.';
    DAT_0024bc70_1._2_1_ = '.';
    DAT_0024bc70_1._3_1_ = '.';
    DAT_0024bc70_1._4_1_ = '.';
    DAT_0024bc70_1._5_1_ = '.';
    DAT_0024bc70_1._6_1_ = '.';
    uRam000000000024bc78 = 0x2e2e2e2e2e2e2e;
    DAT_0024bc7f = 0x2e;
    DAT_0024bc60 = '.';
    DAT_0024bc60_1._0_1_ = '.';
    DAT_0024bc60_1._1_1_ = '.';
    DAT_0024bc60_1._2_1_ = '.';
    DAT_0024bc60_1._3_1_ = '.';
    DAT_0024bc60_1._4_1_ = '.';
    DAT_0024bc60_1._5_1_ = '.';
    DAT_0024bc60_1._6_1_ = '.';
    uRam000000000024bc68._0_1_ = '.';
    uRam000000000024bc68._1_1_ = '.';
    uRam000000000024bc68._2_1_ = '.';
    uRam000000000024bc68._3_1_ = '.';
    uRam000000000024bc68._4_1_ = '.';
    uRam000000000024bc68._5_1_ = '.';
    uRam000000000024bc68._6_1_ = '.';
    uRam000000000024bc68._7_1_ = '.';
    DAT_0024bc50 = '.';
    DAT_0024bc50_1._0_1_ = '.';
    DAT_0024bc50_1._1_1_ = '.';
    DAT_0024bc50_1._2_1_ = '.';
    DAT_0024bc50_1._3_1_ = '.';
    DAT_0024bc50_1._4_1_ = '.';
    DAT_0024bc50_1._5_1_ = '.';
    DAT_0024bc50_1._6_1_ = '.';
    uRam000000000024bc58._0_1_ = '.';
    uRam000000000024bc58._1_1_ = '.';
    uRam000000000024bc58._2_1_ = '.';
    uRam000000000024bc58._3_1_ = '.';
    uRam000000000024bc58._4_1_ = '.';
    uRam000000000024bc58._5_1_ = '.';
    uRam000000000024bc58._6_1_ = '.';
    uRam000000000024bc58._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000024bc48._0_1_ = '.';
    uRam000000000024bc48._1_1_ = '.';
    uRam000000000024bc48._2_1_ = '.';
    uRam000000000024bc48._3_1_ = '.';
    uRam000000000024bc48._4_1_ = '.';
    uRam000000000024bc48._5_1_ = '.';
    uRam000000000024bc48._6_1_ = '.';
    uRam000000000024bc48._7_1_ = '.';
    DAT_0024bc8f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}